

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconhmp.cpp
# Opt level: O2

CVmFmtTabStop * __thiscall CVmFormatter::find_tab(CVmFormatter *this,wchar_t *id,int create)

{
  CVmHashTable *this_00;
  CVmHashFunc *hash_function;
  CVmFmtTabStop *pCVar1;
  
  this_00 = this->tabs_;
  if (this_00 == (CVmHashTable *)0x0) {
    this_00 = (CVmHashTable *)operator_new(0x20);
    hash_function = (CVmHashFunc *)operator_new(8);
    hash_function->_vptr_CVmHashFunc = (_func_int **)&PTR__CVmHashFunc_0035e8a8;
    CVmHashTable::CVmHashTable(this_00,0x40,hash_function,1);
    this->tabs_ = this_00;
  }
  pCVar1 = CVmFmtTabStop::find(this_00,id,create);
  return pCVar1;
}

Assistant:

CVmFmtTabStop *CVmFormatter::find_tab(wchar_t *id, int create)
{
    /* if we don't have a hash table yet, create one */
    if (tabs_ == 0)
        tabs_ = new CVmHashTable(64, new CVmHashFuncCS(), TRUE);

    /* find the tab */
    return CVmFmtTabStop::find(tabs_, id, create);
}